

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O2

RequireResult __thiscall
duckdb::SQLLogicTestRunner::CheckRequire
          (SQLLogicTestRunner *this,SQLLogicParser *parser,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *params)

{
  DBConfig DVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  const_reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  unsigned_long uVar9;
  pointer pDVar10;
  char *pcVar11;
  long lVar12;
  type pDVar13;
  long lVar14;
  RequireResult RVar15;
  RequireResult RVar16;
  RequireResult RVar17;
  allocator local_b1;
  optional_idx limit;
  string param;
  optional_idx available_space;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((params->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (params->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string
              ((string *)&limit,"require requires a single parameter",(allocator *)&param);
    SQLLogicParser::Fail<>(parser,(string *)&limit);
    std::__cxx11::string::~string((string *)&limit);
  }
  RVar15 = PRESENT;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  get<true>(params,0);
  duckdb::StringUtil::Lower((string *)&param);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &param,"notmusl");
  RVar17 = PRESENT;
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &param,"notmingw"), bVar2)) goto LAB_003f80cb;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &param,"mingw");
  RVar16 = MISSING;
  RVar17 = RVar16;
  if ((bVar2) ||
     ((((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&param,"notwindows"), RVar17 = RVar15, bVar2 ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&param,"windows"), RVar17 = RVar16, bVar2)) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&param,"longdouble"), bVar2)) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &param,"64bit"), RVar17 = RVar15, bVar2)))) goto LAB_003f80cb;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &param,"noforcestorage");
  if (bVar2) {
    bVar2 = TestForceStorage();
    RVar17 = (uint)bVar2;
    goto LAB_003f80cb;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &param,"nothreadsan");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &param,"strinline"), bVar2)) goto LAB_003f80cb;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &param,"ram");
  if (bVar2) {
    if ((long)(params->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(params->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      std::__cxx11::string::string
                ((string *)&limit,"require ram requires a parameter",(allocator *)&available_space);
      SQLLogicParser::Fail<>(parser,(string *)&limit);
      std::__cxx11::string::~string((string *)&limit);
    }
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(params,1);
    uVar6 = duckdb::DBConfig::ParseMemoryLimit((string *)pvVar5);
    limit.index = duckdb::FileSystem::GetAvailableMemory();
    if (limit.index == 0xffffffffffffffff) {
LAB_003f82bd:
      RVar17 = MISSING;
      goto LAB_003f80cb;
    }
    uVar7 = optional_idx::GetIndex(&limit);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &param,"disk_space");
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &param,"vector_size");
      if (bVar2) {
        if ((long)(params->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(params->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x40) {
          std::__cxx11::string::string
                    ((string *)&limit,"require vector_size requires a parameter",
                     (allocator *)&available_space);
          SQLLogicParser::Fail<>(parser,(string *)&limit);
          std::__cxx11::string::~string((string *)&limit);
        }
        pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(params,1);
        iVar4 = std::__cxx11::stoi((string *)pvVar5,(size_t *)0x0,10);
        uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar4);
        RVar17 = (uint)(0x800 < uVar9);
        goto LAB_003f80cb;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &param,"exact_vector_size");
      if (bVar2) {
        if ((long)(params->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(params->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x40) {
          std::__cxx11::string::string
                    ((string *)&limit,"require exact_vector_size requires a parameter",
                     (allocator *)&available_space);
          SQLLogicParser::Fail<>(parser,(string *)&limit);
          std::__cxx11::string::~string((string *)&limit);
        }
        pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(params,1);
        iVar4 = std::__cxx11::stoi((string *)pvVar5,(size_t *)0x0,10);
        uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar4);
        bVar2 = uVar9 == 0x800;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&param,"block_size");
        if (bVar2) {
          if ((long)(params->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(params->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x40) {
            std::__cxx11::string::string
                      ((string *)&limit,"require block_size requires a parameter",
                       (allocator *)&available_space);
            SQLLogicParser::Fail<>(parser,(string *)&limit);
            std::__cxx11::string::~string((string *)&limit);
          }
          pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>(params,1);
          iVar4 = std::__cxx11::stoi((string *)pvVar5,(size_t *)0x0,10);
          uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar4);
          pDVar10 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::
                    operator->(&this->config);
          bVar2 = *(unsigned_long *)(pDVar10 + 0x430) == uVar9;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&param,"skip_reload");
          if (bVar2) {
            this->skip_reload = true;
            goto LAB_003f80cb;
          }
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&param,"no_alternative_verify");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&param,"no_block_verification"), bVar2)) goto LAB_003f80cb;
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&param,"no_vector_verification");
          if (!bVar2) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&param,"no_extension_autoloading");
            if (bVar2) {
              if ((ulong)((long)(params->
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(params->
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                std::__cxx11::string::string
                          ((string *)&limit,
                           "require no_extension_autoloading needs an explanation string",
                           (allocator *)&available_space);
                SQLLogicParser::Fail<>(parser,(string *)&limit);
                std::__cxx11::string::~string((string *)&limit);
              }
              available_space.index = (idx_t)local_60;
              local_60[0] = 0;
              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::get<true>(params,1);
              if ((pvVar5->_M_string_length == 0) ||
                 (pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           ::get<true>(params,1), *(pvVar5->_M_dataplus)._M_p != '\"')) {
                std::__cxx11::string::string
                          ((string *)&limit,"Quoted parameter should start with double quotes",
                           &local_b1);
                SQLLogicParser::Fail<>(parser,(string *)&limit);
                std::__cxx11::string::~string((string *)&limit);
              }
              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::get<true>(params,1);
              std::__cxx11::string::substr((ulong)&limit,(ulong)pvVar5);
              std::__cxx11::string::append((string *)&available_space);
              std::__cxx11::string::~string((string *)&limit);
              uVar6 = 2;
              do {
                if ((ulong)((long)(params->
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(params->
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6)
                goto LAB_003f8629;
                pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::get<true>(params,uVar6);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &limit," ",pvVar5);
                std::__cxx11::string::append((string *)&available_space);
                std::__cxx11::string::~string((string *)&limit);
                uVar6 = uVar6 + 1;
              } while (*(char *)(available_space.index - 1) != '\"');
              std::__cxx11::string::pop_back();
LAB_003f8629:
              lVar12 = std::__cxx11::string::rfind((char *)&available_space,0x4766b4);
              if ((lVar12 != 0) &&
                 (lVar12 = std::__cxx11::string::rfind((char *)&available_space,0x4766bd),
                 lVar12 != 0)) {
                std::__cxx11::string::string
                          ((string *)&limit,
                           "require no_extension_autoloading explanation string should begin with either \'EXPECTED\' or FIXME\'"
                           ,&local_b1);
                SQLLogicParser::Fail<>(parser,(string *)&limit);
                std::__cxx11::string::~string((string *)&limit);
              }
              pDVar10 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::
                        operator->(&this->config);
              DVar1 = pDVar10[0xe2];
              std::__cxx11::string::~string((string *)&available_space);
              RVar17 = (uint)(byte)DVar1;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&param,"allow_unsigned_extensions");
              if (bVar2) {
                pDVar10 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                          ::operator->(&this->config);
                RVar17 = (byte)pDVar10[0x350] ^ MISSING;
              }
              else {
                lVar12 = 0;
                do {
                  lVar14 = lVar12;
                  if (lVar14 == 0xb8) break;
                  bVar2 = std::operator==(*(char **)((long)&AUTOLOADABLE_EXTENSIONS + lVar14),
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&param);
                  lVar12 = lVar14 + 8;
                } while (!bVar2);
                pDVar10 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>
                          ::operator->(&this->config);
                if (pDVar10[0xe2] == (DBConfig)0x0) {
                  pDVar13 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::
                            operator*(&this->db);
                  cVar3 = duckdb::ExtensionHelper::LoadExtension(pDVar13,(string *)&param);
                  RVar17 = RVar16;
                  if (cVar3 == '\x02') goto LAB_003f80cb;
                  if (cVar3 == '\x01') {
                    std::__cxx11::string::string
                              ((string *)&limit,"unknown extension type: %s",
                               (allocator *)&available_space);
                    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ::get<true>(params,0);
                    std::__cxx11::string::string((string *)&local_50,(string *)pvVar5);
                    SQLLogicParser::Fail<std::__cxx11::string>(parser,(string *)&limit,&local_50);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&limit);
                  }
                  else if (cVar3 == '\0') {
                    std::__detail::
                    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)&this->extensions,&param);
                  }
                }
                else {
                  RVar17 = RVar16;
                  if (lVar14 == 0xb8) goto LAB_003f80cb;
                }
                RVar17 = PRESENT;
              }
            }
            goto LAB_003f80cb;
          }
          pcVar11 = getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
          bVar2 = pcVar11 == (char *)0x0;
        }
      }
      RVar17 = (uint)!bVar2;
      goto LAB_003f80cb;
    }
    if ((long)(params->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(params->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      std::__cxx11::string::string
                ((string *)&limit,"require disk_space requires a parameter",
                 (allocator *)&available_space);
      SQLLogicParser::Fail<>(parser,(string *)&limit);
      std::__cxx11::string::~string((string *)&limit);
    }
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(params,1);
    uVar6 = duckdb::DBConfig::ParseMemoryLimit((string *)pvVar5);
    std::__cxx11::string::string((string *)&limit,".",&local_b1);
    iVar8 = duckdb::FileSystem::GetAvailableDiskSpace((string *)&limit);
    available_space.index = iVar8;
    std::__cxx11::string::~string((string *)&limit);
    if (iVar8 == 0xffffffffffffffff) goto LAB_003f82bd;
    uVar7 = optional_idx::GetIndex(&available_space);
  }
  RVar17 = (uint)(uVar7 < uVar6);
LAB_003f80cb:
  std::__cxx11::string::~string((string *)&param);
  return RVar17;
}

Assistant:

RequireResult SQLLogicTestRunner::CheckRequire(SQLLogicParser &parser, const vector<string> &params) {
	if (params.size() < 1) {
		parser.Fail("require requires a single parameter");
	}
	// require command
	string param = StringUtil::Lower(params[0]);
	// os specific stuff

	if (param == "notmusl") {
#ifdef __MUSL_ENABLED__
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}
	if (param == "notmingw") {
#ifdef __MINGW32__
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "mingw") {
#ifndef __MINGW32__
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "notwindows") {
#ifdef _WIN32
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "windows") {
#ifndef _WIN32
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "longdouble") {
#if LDBL_MANT_DIG < 54
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "64bit") {
		if (sizeof(void *) != 8) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "noforcestorage") {
		if (TestForceStorage()) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "nothreadsan") {
#ifdef DUCKDB_THREAD_SANITIZER
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "strinline") {
#ifdef DUCKDB_DEBUG_NO_INLINE
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "ram") {
		if (params.size() != 2) {
			parser.Fail("require ram requires a parameter");
		}
		// require a minimum amount of ram
		auto required_limit = DBConfig::ParseMemoryLimit(params[1]);
		auto limit = FileSystem::GetAvailableMemory();
		if (!limit.IsValid()) {
			return RequireResult::MISSING;
		}
		if (limit.GetIndex() < required_limit) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "disk_space") {
		if (params.size() != 2) {
			parser.Fail("require disk_space requires a parameter");
		}
		// require a minimum amount of disk space
		auto required_limit = DBConfig::ParseMemoryLimit(params[1]);
		auto available_space = FileSystem::GetAvailableDiskSpace(".");
		if (!available_space.IsValid()) {
			return RequireResult::MISSING;
		}
		if (available_space.GetIndex() < required_limit) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "vector_size") {
		if (params.size() != 2) {
			parser.Fail("require vector_size requires a parameter");
		}
		// require a specific vector size
		auto required_vector_size = NumericCast<idx_t>(std::stoi(params[1]));
		if (STANDARD_VECTOR_SIZE < required_vector_size) {
			// vector size is too low for this test: skip it
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "exact_vector_size") {
		if (params.size() != 2) {
			parser.Fail("require exact_vector_size requires a parameter");
		}
		// require an exact vector size
		auto required_vector_size = NumericCast<idx_t>(std::stoi(params[1]));
		if (STANDARD_VECTOR_SIZE != required_vector_size) {
			// vector size does not match the required vector size: skip it
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "block_size") {
		if (params.size() != 2) {
			parser.Fail("require block_size requires a parameter");
		}
		// require a specific block size
		auto required_block_size = NumericCast<idx_t>(std::stoi(params[1]));
		if (config->options.default_block_alloc_size != required_block_size) {
			// block size does not match the required block size: skip it
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}

	if (param == "skip_reload") {
		skip_reload = true;
		return RequireResult::PRESENT;
	}

	if (param == "no_alternative_verify") {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "no_block_verification") {
#ifdef DUCKDB_BLOCK_VERIFICATION
		return RequireResult::MISSING;
#else
		return RequireResult::PRESENT;
#endif
	}

	if (param == "no_vector_verification") {
		auto verify_vector = std::getenv("DUCKDB_DEBUG_VERIFY_VECTOR");
		if (verify_vector) {
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}
	if (param == "no_extension_autoloading") {
		if (params.size() < 2) {
			parser.Fail("require no_extension_autoloading needs an explanation string");
		}
		size_t index = 1;
		string explanation = ParseExplanation(parser, params, index);
		if (explanation.rfind("EXPECTED", 0) == 0 || explanation.rfind("FIXME", 0) == 0) {
			// good, explanation is properly formatted
		} else {
			parser.Fail(
			    "require no_extension_autoloading explanation string should begin with either 'EXPECTED' or FIXME'");
		}
		if (config->options.autoload_known_extensions) {
			// If autoloading is on, we skip this test
			return RequireResult::MISSING;
		}
		return RequireResult::PRESENT;
	}
	if (param == "allow_unsigned_extensions") {
		if (config->options.allow_unsigned_extensions) {
			return RequireResult::PRESENT;
		}
		return RequireResult::MISSING;
	}

	bool excluded_from_autoloading = true;
	for (const auto &ext : AUTOLOADABLE_EXTENSIONS) {
		if (ext == param) {
			excluded_from_autoloading = false;
			break;
		}
	}

	if (!config->options.autoload_known_extensions) {
		auto result = ExtensionHelper::LoadExtension(*db, param);
		if (result == ExtensionLoadResult::LOADED_EXTENSION) {
			// add the extension to the list of loaded extensions
			extensions.insert(param);
		} else if (result == ExtensionLoadResult::EXTENSION_UNKNOWN) {
			parser.Fail("unknown extension type: %s", params[0]);
		} else if (result == ExtensionLoadResult::NOT_LOADED) {
			// extension known but not build: skip this test
			return RequireResult::MISSING;
		}
	} else if (excluded_from_autoloading) {
		return RequireResult::MISSING;
	}
	return RequireResult::PRESENT;
}